

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Periodic_get64(int g_a,int64_t *lo,int64_t *hi,void *buf,int64_t *ld)

{
  long lVar1;
  long lVar2;
  Integer _ga_work [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer local_e8 [7];
  long lStack_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [8];
  
  lVar1 = pnga_ndim((long)g_a);
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      (&lStack_70)[lVar2] = *lo + 1;
      lo = lo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      (&lStack_b0)[lVar2] = *hi + 1;
      hi = hi + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  if (1 < lVar1) {
    do {
      local_e8[lVar1 + -2] = *ld;
      lVar1 = lVar1 + -1;
      ld = ld + 1;
    } while (lVar1 != 1);
  }
  pnga_periodic((long)g_a,local_68,local_a8,buf,local_e8,(void *)0x0,1);
  return;
}

Assistant:

void NGA_Periodic_get64(int g_a, int64_t lo[], int64_t hi[], void* buf, int64_t ld[])
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    Integer _ga_work[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    COPYC2F(ld,_ga_work, ndim-1);
    wnga_periodic(a, _ga_lo, _ga_hi, buf, _ga_work, NULL, PERIODIC_GET);
}